

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O1

vector<COutPoint,_std::allocator<COutPoint>_> * __thiscall
wallet::CCoinControl::ListSelected
          (vector<COutPoint,_std::allocator<COutPoint>_> *__return_storage_ptr__,CCoinControl *this)

{
  iterator __position;
  undefined8 uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  _Rb_tree_color local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var5 = (this->m_selected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->m_selected)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    local_38 = p_Var5[2]._M_color;
    local_58._0_8_ = *(undefined8 *)(p_Var5 + 1);
    local_58._8_8_ = p_Var5[1]._M_parent;
    local_48 = p_Var5[1]._M_left;
    p_Stack_40 = p_Var5[1]._M_right;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<COutPoint,_std::allocator<COutPoint>_>::_M_realloc_insert<COutPoint>
                (__return_storage_ptr__,__position,(COutPoint *)local_58);
    }
    else {
      uVar1 = *(undefined8 *)(p_Var5 + 1);
      p_Var2 = p_Var5[1]._M_parent;
      p_Var3 = p_Var5[1]._M_left;
      p_Var4 = p_Var5[1]._M_right;
      (__position._M_current)->n = p_Var5[2]._M_color;
      *(_Base_ptr *)
       (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
           p_Var3;
      *(_Base_ptr *)
       (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
           p_Var4;
      *(undefined8 *)((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
           = uVar1;
      *(_Base_ptr *)
       (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
           p_Var2;
      (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<COutPoint> CCoinControl::ListSelected() const
{
    std::vector<COutPoint> outpoints;
    std::transform(m_selected.begin(), m_selected.end(), std::back_inserter(outpoints),
        [](const std::map<COutPoint, PreselectedInput>::value_type& pair) {
            return pair.first;
        });
    return outpoints;
}